

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void symlink_cb(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *__s1;
  uv_fs_t *puVar3;
  long alStack_1238 [3];
  undefined1 auStack_1220 [440];
  uv_fs_t *puStack_1068;
  undefined8 uStack_1030;
  char acStack_1028 [7];
  undefined4 auStack_1021 [1024];
  uv_fs_t *puStack_20;
  
  if (req->fs_type == UV_FS_SYMLINK) {
    if (req->result == 0) {
      symlink_cb_count = symlink_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    symlink_cb_cold_1();
  }
  symlink_cb_cold_2();
  if (req->fs_type == UV_FS_READLINK) {
    unaff_RBX = req;
    __s1 = req;
    if (req->result != 0) goto LAB_0015f3ee;
    __s1 = (uv_fs_t *)req->ptr;
    iVar1 = strcmp((char *)__s1,"test_file_symlink2");
    if (iVar1 == 0) {
      readlink_cb_count = readlink_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    readlink_cb_cold_1();
    __s1 = req;
LAB_0015f3ee:
    readlink_cb_cold_2();
  }
  readlink_cb_cold_3();
  uStack_1030 = 0x1000;
  puVar3 = __s1;
  puStack_20 = unaff_RBX;
  if (__s1->fs_type == UV_FS_REALPATH) {
    if (__s1->result == 0) {
      uv_cwd(acStack_1028,&uStack_1030);
      sVar2 = strlen(acStack_1028);
      builtin_strncpy(acStack_1028 + sVar2,"/test_fi",8);
      *(undefined4 *)((long)auStack_1021 + sVar2) = 0x656c69;
      puVar3 = (uv_fs_t *)__s1->ptr;
      iVar1 = strcmp((char *)puVar3,acStack_1028);
      if (iVar1 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        uv_fs_req_cleanup(__s1);
        return;
      }
      goto LAB_0015f47f;
    }
  }
  else {
    realpath_cb_cold_1();
    __s1 = unaff_RBX;
  }
  realpath_cb_cold_2();
LAB_0015f47f:
  realpath_cb_cold_3();
  puStack_1068 = __s1;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  alStack_1238[0] = 0x1000;
  loop = (uv_loop_t *)uv_default_loop();
  uv_fs_mkdir(0,auStack_1220,"test_dir",0x1ff,0);
  uv_fs_req_cleanup(auStack_1220);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,alStack_1238);
  sVar2 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar2,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[1] = '\0';
  alStack_1238[0] = alStack_1238[0] + 9;
  iVar1 = uv_fs_symlink(0,auStack_1220,"test_dir","test_dir_symlink",(ulong)puVar3 & 0xffffffff,0);
  if (((int)puVar3 == 1) && ((iVar1 == -1 || (iVar1 == -0x5f)))) {
    test_symlink_dir_impl_cold_1();
  }
  else {
    test_symlink_dir_impl_cold_2();
  }
  return;
}

Assistant:

static void symlink_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_SYMLINK);
  ASSERT(req->result == 0);
  symlink_cb_count++;
  uv_fs_req_cleanup(req);
}